

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rangeproof_impl.h
# Opt level: O3

void secp256k1_rangeproof_pub_expand
               (secp256k1_gej *pubs,int exp,size_t *rsizes,size_t rings,secp256k1_ge *genp)

{
  secp256k1_fe *rzr;
  ulong uVar1;
  ulong uVar2;
  secp256k1_gej *a;
  long lVar3;
  secp256k1_gej base;
  secp256k1_gej tmp;
  secp256k1_gej local_138;
  secp256k1_gej local_b0;
  
  local_138.infinity = genp->infinity;
  local_138.x.n[0] = (genp->x).n[0];
  local_138.x.n[1] = (genp->x).n[1];
  local_138.x.n[2] = (genp->x).n[2];
  local_138.x.n[3] = (genp->x).n[3];
  local_138.x.n[4] = (genp->x).n[4];
  local_138.y.n[0] = (genp->y).n[0];
  local_138.y.n[1] = (genp->y).n[1];
  local_138.y.n[2] = (genp->y).n[2];
  local_138.y.n[3] = (genp->y).n[3];
  local_138.y.n[4] = (genp->y).n[4];
  local_138.z.n[0] = 1;
  local_138.z.n[1] = 0;
  local_138.z.n[2] = 0;
  local_138.z.n[3] = 0;
  local_138.z.n[4] = 0;
  rzr = (secp256k1_fe *)rings;
  secp256k1_gej_neg(&local_138,&local_138);
  if (0 < exp) {
    do {
      if (local_138.infinity == 0) {
        secp256k1_gej_double(&local_b0,&local_138);
        if ((local_b0.infinity != 0) ||
           (secp256k1_gej_double(&local_138,&local_b0), local_138.infinity != 0)) goto LAB_0015598e;
        secp256k1_gej_double(&local_138,&local_138);
      }
      else {
        local_b0.infinity = 1;
LAB_0015598e:
        local_138.infinity = 1;
      }
      exp = exp + -1;
      secp256k1_gej_add_var(&local_138,&local_138,&local_b0,rzr);
    } while (exp != 0);
  }
  if (rings != 0) {
    lVar3 = 0;
    uVar1 = 0;
    do {
      if (1 < rsizes[uVar1]) {
        uVar2 = 1;
        a = pubs + lVar3;
        do {
          secp256k1_gej_add_var(a + 1,a,&local_138,rzr);
          uVar2 = uVar2 + 1;
          a = a + 1;
        } while (uVar2 < rsizes[uVar1]);
      }
      if (uVar1 < rings - 1) {
        if ((local_138.infinity == 0) &&
           (secp256k1_gej_double(&local_138,&local_138), local_138.infinity == 0)) {
          secp256k1_gej_double(&local_138,&local_138);
        }
        else {
          local_138.infinity = 1;
        }
      }
      lVar3 = lVar3 + rsizes[uVar1];
      uVar1 = uVar1 + 1;
    } while (uVar1 != rings);
  }
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_rangeproof_pub_expand(secp256k1_gej *pubs,
 int exp, size_t *rsizes, size_t rings, const secp256k1_ge* genp) {
    secp256k1_gej base;
    size_t i;
    size_t j;
    size_t npub;
    VERIFY_CHECK(exp < 19);
    if (exp < 0) {
        exp = 0;
    }
    secp256k1_gej_set_ge(&base, genp);
    secp256k1_gej_neg(&base, &base);
    while (exp--) {
        /* Multiplication by 10 */
        secp256k1_gej tmp;
        secp256k1_gej_double_var(&tmp, &base, NULL);
        secp256k1_gej_double_var(&base, &tmp, NULL);
        secp256k1_gej_double_var(&base, &base, NULL);
        secp256k1_gej_add_var(&base, &base, &tmp, NULL);
    }
    npub = 0;
    for (i = 0; i < rings; i++) {
        for (j = 1; j < rsizes[i]; j++) {
            secp256k1_gej_add_var(&pubs[npub + j], &pubs[npub + j - 1], &base, NULL);
        }
        if (i < rings - 1) {
            secp256k1_gej_double_var(&base, &base, NULL);
            secp256k1_gej_double_var(&base, &base, NULL);
        }
        npub += rsizes[i];
    }
}